

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepExporter.cpp
# Opt level: O0

void Assimp::ExportSceneStep
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  DeadlyImportError *this;
  pointer pIVar3;
  undefined8 uVar4;
  streamoff sVar5;
  fpos local_468 [16];
  string local_458 [38];
  undefined1 local_432;
  allocator<char> local_431;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_3f0;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> outfile;
  StepExporter iDoTheExportThing;
  ExportProperties props;
  string local_c0;
  undefined1 local_a0 [8];
  string file;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string path;
  ExportProperties *pProperties_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  
  path.field_2._8_8_ = pProperties;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pFile,&local_69);
  DefaultIOSystem::absolutePath((string *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,pFile,
             (allocator<char> *)
             ((long)&props.mMatrixProperties._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  DefaultIOSystem::completeBaseName((string *)local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&props.mMatrixProperties._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  ExportProperties::ExportProperties
            ((ExportProperties *)
             &iDoTheExportThing.meshes._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (ExportProperties *)path.field_2._8_8_);
  StepExporter::StepExporter
            ((StepExporter *)&outfile,pScene,pIOSystem,(string *)local_48,(string *)local_a0,
             (ExportProperties *)
             &iDoTheExportThing.meshes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  iVar2 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_3f0,
             (pointer)CONCAT44(extraout_var,iVar2));
  bVar1 = std::operator==(&local_3f0,(nullptr_t)0x0);
  if (!bVar1) {
    pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_3f0);
    std::__cxx11::stringstream::str();
    uVar4 = std::__cxx11::string::c_str();
    local_468 = (fpos  [16])std::ostream::tellp();
    sVar5 = std::fpos::operator_cast_to_long(local_468);
    (*pIVar3->_vptr_IOStream[3])(pIVar3,uVar4,sVar5,1);
    std::__cxx11::string::~string(local_458);
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              (&local_3f0);
    StepExporter::~StepExporter((StepExporter *)&outfile);
    ExportProperties::~ExportProperties
              ((ExportProperties *)
               &iDoTheExportThing.meshes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_48);
    return;
  }
  local_432 = 1;
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,pFile,&local_431);
  std::operator+(&local_410,"could not open output .stp file: ",&local_430);
  DeadlyImportError::DeadlyImportError(this,&local_410);
  local_432 = 0;
  __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void ExportSceneStep(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* pProperties)
{
    std::string path = DefaultIOSystem::absolutePath(std::string(pFile));
    std::string file = DefaultIOSystem::completeBaseName(std::string(pFile));

    // create/copy Properties
    ExportProperties props(*pProperties);

    // invoke the exporter
    StepExporter iDoTheExportThing( pScene, pIOSystem, path, file, &props);

    // we're still here - export successfully completed. Write result to the given IOSYstem
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .stp file: " + std::string(pFile));
    }

    // XXX maybe use a small wrapper around IOStream that behaves like std::stringstream in order to avoid the extra copy.
    outfile->Write( iDoTheExportThing.mOutput.str().c_str(), static_cast<size_t>(iDoTheExportThing.mOutput.tellp()),1);
}